

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.hpp
# Opt level: O1

value_type * __thiscall
poplar::
map<poplar::plain_bonsai_trie<90U,_poplar::hash::vigna_hasher>,_poplar::plain_bonsai_nlm<int>_>::
update(map<poplar::plain_bonsai_trie<90U,_poplar::hash::vigna_hasher>,_poplar::plain_bonsai_nlm<int>_>
       *this,char_range key)

{
  plain_bonsai_trie<90U,_poplar::hash::vigna_hasher> *this_00;
  uint32_t uVar1;
  __uniq_ptr_data<unsigned_char,_std::default_delete<unsigned_char[]>,_true,_true> _Var2;
  undefined1 auVar3 [16];
  vector<std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>,_std::allocator<std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>_>_>
  *pvVar4;
  bool bVar5;
  value_type_conflict3 *pvVar6;
  undefined8 *puVar7;
  char *pcVar8;
  uint32_t uVar9;
  ulong uVar10;
  ulong uVar11;
  _Head_base<0UL,_unsigned_char_*,_false> unaff_R13;
  uint64_t node_id;
  char_range local_208;
  undefined1 local_1f8 [16];
  pointer local_1e8;
  map<poplar::plain_bonsai_trie<90U,_poplar::hash::vigna_hasher>,_poplar::plain_bonsai_nlm<int>_>
  local_1d8;
  
  local_208.end = key.end;
  local_208.begin = key.begin;
  if (local_208.begin == local_208.end) {
    puVar7 = (undefined8 *)__cxa_allocate_exception(0x10);
    *puVar7 = &PTR__exception_00108d90;
    pcVar8 = 
    "/workspace/llm4binary/github/license_c_cmakelists/kampersanda[P]poplar-trie/include/poplar/map.hpp:122:key must be a non-empty string."
    ;
  }
  else {
    if (local_208.end[-1] == 0) {
      this_00 = &this->hash_trie_;
      if ((this->hash_trie_).size_ == 0) {
        if (this->is_ready_ == false) {
          map(&local_1d8,0,0x20);
          this->is_ready_ = local_1d8.is_ready_;
          *(undefined7 *)&this->field_0x1 = local_1d8._1_7_;
          this->lambda_ = local_1d8.lambda_;
          std::vector<unsigned_long,_std::allocator<unsigned_long>_>::_M_move_assign
                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)this_00,
                     &local_1d8.hash_trie_);
          (this->hash_trie_).table_.width_ = local_1d8.hash_trie_.table_.width_;
          (this->hash_trie_).table_.size_ = local_1d8.hash_trie_.table_.size_;
          (this->hash_trie_).table_.mask_ = local_1d8.hash_trie_.table_.mask_;
          (this->hash_trie_).capa_size_.bits_ = local_1d8.hash_trie_.capa_size_.bits_;
          *(undefined4 *)&(this->hash_trie_).capa_size_.field_0x4 =
               local_1d8.hash_trie_.capa_size_._4_4_;
          (this->hash_trie_).capa_size_.mask_ = local_1d8.hash_trie_.capa_size_.mask_;
          (this->hash_trie_).symb_size_.bits_ = local_1d8.hash_trie_.symb_size_.bits_;
          *(undefined4 *)&(this->hash_trie_).symb_size_.field_0x4 =
               local_1d8.hash_trie_.symb_size_._4_4_;
          (this->hash_trie_).symb_size_.mask_ = local_1d8.hash_trie_.symb_size_.mask_;
          (this->hash_trie_).size_ = local_1d8.hash_trie_.size_;
          (this->hash_trie_).max_size_ = local_1d8.hash_trie_.max_size_;
          (this->hash_trie_).capa_size_.bits_ = local_1d8.hash_trie_.capa_size_.bits_;
          *(undefined4 *)&(this->hash_trie_).capa_size_.field_0x4 =
               local_1d8.hash_trie_.capa_size_._4_4_;
          (this->hash_trie_).capa_size_.mask_ = local_1d8.hash_trie_.capa_size_.mask_;
          pvVar4 = &(this->label_store_).ptrs_;
          auVar3._0_8_ = (pvVar4->
                         super__Vector_base<std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>,_std::allocator<std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>_>_>
                         )._M_impl.super__Vector_impl_data._M_start;
          auVar3._8_8_ = (pvVar4->
                         super__Vector_base<std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>,_std::allocator<std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>_>_>
                         )._M_impl.super__Vector_impl_data._M_finish;
          local_1e8 = (this->label_store_).ptrs_.
                      super__Vector_base<std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>,_std::allocator<std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage;
          (this->label_store_).ptrs_.
          super__Vector_base<std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>,_std::allocator<std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start =
               local_1d8.label_store_.ptrs_.
               super__Vector_base<std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>,_std::allocator<std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
          (this->label_store_).ptrs_.
          super__Vector_base<std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>,_std::allocator<std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish =
               local_1d8.label_store_.ptrs_.
               super__Vector_base<std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>,_std::allocator<std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
          (this->label_store_).ptrs_.
          super__Vector_base<std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>,_std::allocator<std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage =
               local_1d8.label_store_.ptrs_.
               super__Vector_base<std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>,_std::allocator<std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage;
          local_1f8._8_8_ = SUB168(ZEXT816(0),4);
          local_1d8.label_store_.ptrs_.
          super__Vector_base<std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>,_std::allocator<std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          local_1d8.label_store_.ptrs_.
          super__Vector_base<std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>,_std::allocator<std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)local_1f8._8_8_;
          local_1d8.label_store_.ptrs_.
          super__Vector_base<std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>,_std::allocator<std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          local_1f8 = auVar3;
          std::
          vector<std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>,_std::allocator<std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>_>_>
          ::~vector((vector<std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>,_std::allocator<std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>_>_>
                     *)local_1f8);
          (this->label_store_).size_ = local_1d8.label_store_.size_;
          (this->label_store_).label_bytes_ = local_1d8.label_store_.label_bytes_;
          memcpy(&this->codes_,&local_1d8.codes_,0x110);
          ~map(&local_1d8);
        }
        this->size_ = this->size_ + 1;
        (this->hash_trie_).size_ = 1;
        unaff_R13._M_head_impl =
             (uchar *)plain_bonsai_nlm<int>::insert(&this->label_store_,1,&local_208);
      }
      else {
        local_1d8._0_8_ = 1;
        do {
          if (local_208.begin == local_208.end) {
            return (value_type *)
                   (_Head_base<0UL,_unsigned_char_*,_false>)
                   *(_Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_> *)
                    &(this->label_store_).ptrs_.
                     super__Vector_base<std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>,_std::allocator<std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[local_1d8._0_8_]._M_t.
                     super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>;
          }
          _Var2.super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t.
          super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
          super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl =
               (this->label_store_).ptrs_.
               super__Vector_base<std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>,_std::allocator<std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start[local_1d8._0_8_]._M_t.
               super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>;
          uVar11 = (long)local_208.end - (long)local_208.begin;
          if (uVar11 != 0) {
            uVar10 = 0;
            do {
              if (local_208.begin[uVar10] !=
                  *(byte *)((long)_Var2.
                                  super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>
                                  .super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl +
                           uVar10)) {
                pvVar6 = (value_type_conflict3 *)0x0;
                goto LAB_00103de1;
              }
              uVar10 = uVar10 + 1;
            } while (uVar11 != uVar10);
          }
          pvVar6 = (value_type_conflict3 *)
                   ((long)_Var2.
                          super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>
                          .super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl + uVar11);
          uVar10 = uVar11;
LAB_00103de1:
          if (pvVar6 == (value_type_conflict3 *)0x0) {
            local_208.begin = local_208.begin + uVar10;
            if (this->lambda_ <= uVar10) {
              do {
                bVar5 = plain_bonsai_trie<90U,_poplar::hash::vigna_hasher>::add_child
                                  (this_00,(uint64_t *)&local_1d8,0xff);
                if (bVar5) {
                  expand_if_needed_(this,(uint64_t *)&local_1d8);
                }
                uVar10 = uVar10 - this->lambda_;
              } while (this->lambda_ <= uVar10);
            }
            if ((this->codes_)._M_elems[*local_208.begin] == 0xff) {
              uVar1 = this->num_codes_;
              uVar9 = uVar1 + 1;
              this->num_codes_ = uVar9;
              (this->codes_)._M_elems[*local_208.begin] = (uchar)uVar1;
              if (uVar9 == 0xff) {
                puVar7 = (undefined8 *)__cxa_allocate_exception(0x10);
                *puVar7 = &PTR__exception_00108d90;
                pcVar8 = 
                "/workspace/llm4binary/github/license_c_cmakelists/kampersanda[P]poplar-trie/include/poplar/map.hpp:171:"
                ;
                goto LAB_00104045;
              }
            }
            bVar5 = plain_bonsai_trie<90U,_poplar::hash::vigna_hasher>::add_child
                              (this_00,(uint64_t *)&local_1d8,
                               uVar10 << 8 | (ulong)(this->codes_)._M_elems[*local_208.begin]);
            if (bVar5) {
              expand_if_needed_(this,(uint64_t *)&local_1d8);
              local_208.begin = local_208.begin + 1;
              this->size_ = this->size_ + 1;
              pvVar6 = plain_bonsai_nlm<int>::insert(&this->label_store_,local_1d8._0_8_,&local_208)
              ;
              goto LAB_00103ea2;
            }
            local_208.begin = local_208.begin + 1;
            bVar5 = true;
          }
          else {
LAB_00103ea2:
            unaff_R13._M_head_impl = (uchar *)pvVar6;
            bVar5 = false;
          }
        } while (bVar5);
      }
      return (value_type *)unaff_R13._M_head_impl;
    }
    puVar7 = (undefined8 *)__cxa_allocate_exception(0x10);
    *puVar7 = &PTR__exception_00108d90;
    pcVar8 = 
    "/workspace/llm4binary/github/license_c_cmakelists/kampersanda[P]poplar-trie/include/poplar/map.hpp:123:The last character of key must be the null terminator."
    ;
  }
LAB_00104045:
  puVar7[1] = pcVar8;
  __cxa_throw(puVar7,&exception::typeinfo,std::exception::~exception);
}

Assistant:

value_type* update(char_range key) {
        POPLAR_THROW_IF(key.empty(), "key must be a non-empty string.");
        POPLAR_THROW_IF(*(key.end - 1) != '\0', "The last character of key must be the null terminator.");

        if (hash_trie_.size() == 0) {
            if (!is_ready_) {
                *this = this_type{0};
            }
            // The first insertion
            ++size_;
            hash_trie_.add_root();

            if constexpr (trie_type_id == trie_type_ids::FKHASH_TRIE) {
                // assert(hash_trie_.get_root() == label_store_.size());
                return label_store_.append(key);
            }
            if constexpr (trie_type_id == trie_type_ids::BONSAI_TRIE) {
                return label_store_.insert(hash_trie_.get_root(), key);
            }
            // should not come
            assert(false);
        }

        auto node_id = hash_trie_.get_root();

        while (!key.empty()) {
            auto [vptr, match] = label_store_.compare(node_id, key);
            if (vptr != nullptr) {
                return const_cast<value_type*>(vptr);
            }

            key.begin += match;

            while (lambda_ <= match) {
                if (hash_trie_.add_child(node_id, step_symb)) {
                    expand_if_needed_(node_id);
#ifdef POPLAR_EXTRA_STATS
                    ++num_steps_;
#endif
                    if constexpr (trie_type_id == trie_type_ids::FKHASH_TRIE) {
                        assert(node_id == label_store_.size());
                        label_store_.append_dummy();
                    }
                }
                match -= lambda_;
            }

            if (codes_[*key.begin] == UINT8_MAX) {
                // Update table
                codes_[*key.begin] = static_cast<uint8_t>(num_codes_++);
                POPLAR_THROW_IF(UINT8_MAX == num_codes_, "");
            }

            if (hash_trie_.add_child(node_id, make_symb_(*key.begin, match))) {
                expand_if_needed_(node_id);
                ++key.begin;
                ++size_;

                if constexpr (trie_type_id == trie_type_ids::FKHASH_TRIE) {
                    assert(node_id == label_store_.size());
                    return label_store_.append(key);
                }
                if constexpr (trie_type_id == trie_type_ids::BONSAI_TRIE) {
                    return label_store_.insert(node_id, key);
                }
                // should not come
                assert(false);
            }

            ++key.begin;
        }

        auto vptr = label_store_.compare(node_id, key).first;
        return vptr ? const_cast<value_type*>(vptr) : nullptr;
    }